

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.cc
# Opt level: O0

int DSA_SIG_set0(DSA_SIG *sig,BIGNUM *r,BIGNUM *s)

{
  BIGNUM *s_local;
  BIGNUM *r_local;
  DSA_SIG *sig_local;
  
  if ((r == (BIGNUM *)0x0) || (s == (BIGNUM *)0x0)) {
    sig_local._4_4_ = 0;
  }
  else {
    BN_free((BIGNUM *)sig->r);
    BN_free((BIGNUM *)sig->s);
    sig->r = r;
    sig->s = s;
    sig_local._4_4_ = 1;
  }
  return sig_local._4_4_;
}

Assistant:

int DSA_SIG_set0(DSA_SIG *sig, BIGNUM *r, BIGNUM *s) {
  if (r == NULL || s == NULL) {
    return 0;
  }
  BN_free(sig->r);
  BN_free(sig->s);
  sig->r = r;
  sig->s = s;
  return 1;
}